

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregatevulnerabilitytobin.cpp
# Opt level: O1

void doit(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 extraout_RAX;
  int ___argc;
  ulong uVar3;
  char **___argv;
  AggregateVulnerability av;
  char line [4096];
  string sStack_10a0;
  string sStack_1080;
  ulong uStack_1060;
  char *pcStack_1058;
  code *pcStack_1050;
  undefined1 local_1040 [4];
  char local_103c [4];
  char *local_1038 [513];
  
  pcStack_1050 = (code *)0x101349;
  fgets((char *)local_1038,0x1000,_stdin);
  pcStack_1050 = (code *)0x101359;
  pcVar2 = fgets((char *)local_1038,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    uVar3 = 2;
    do {
      pcStack_1050 = (code *)0x101393;
      iVar1 = __isoc99_sscanf(local_1038,"%d,%d",local_1040,local_103c);
      ___argc = (int)uVar3;
      if (iVar1 != 2) {
        ___argv = local_1038;
        pcStack_1050 = main;
        doit();
        pcStack_1050 = (code *)0x102018;
        uStack_1060 = uVar3;
        pcStack_1058 = local_103c;
        iVar1 = getopt(___argc,___argv,"vh");
        if (iVar1 == -1) {
          sStack_1080._M_dataplus._M_p = (pointer)&sStack_1080.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_1080,"","");
          sStack_10a0._M_dataplus._M_p = (pointer)&sStack_10a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10a0,"","");
          initstreams(&sStack_1080,&sStack_10a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_10a0._M_dataplus._M_p != &sStack_10a0.field_2) {
            operator_delete(sStack_10a0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_1080._M_dataplus._M_p != &sStack_1080.field_2) {
            operator_delete(sStack_1080._M_dataplus._M_p);
          }
          doit();
          return;
        }
        if (iVar1 == 0x76) {
          main_cold_1();
        }
        main_cold_2();
        if (sStack_10a0._M_dataplus._M_p != "%d,%d") {
          operator_delete(sStack_10a0._M_dataplus._M_p);
        }
        if (sStack_1080._M_dataplus._M_p != local_103c) {
          operator_delete(sStack_1080._M_dataplus._M_p);
        }
        _Unwind_Resume(extraout_RAX);
      }
      pcStack_1050 = (code *)0x1013ae;
      fwrite(local_1040,8,1,_stdout);
      uVar3 = (ulong)(___argc + 1);
      pcStack_1050 = (code *)0x1013c7;
      pcVar2 = fgets((char *)local_1038,0x1000,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void doit() {

  char line[4096];
  fgets(line, sizeof(line), stdin);   // Read header
  int lineno = 2;
  AggregateVulnerability av;

  while (fgets(line, sizeof(line), stdin) != 0) {

    if (sscanf(line, "%d,%d", &av.aggregatevulnerability_id,
			      &av.vulnerability_id) != 2) {
      fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
      exit(EXIT_FAILURE);
    }
    
    fwrite(&av, sizeof(av), 1, stdout);
    ++lineno;

  }

}